

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-impl.h
# Opt level: O0

size_t ggml_hash_insert(ggml_hash_set *hash_set,ggml_tensor *key)

{
  ulong uVar1;
  _Bool _Var2;
  size_t sVar3;
  ggml_tensor *in_RSI;
  ulong *in_RDI;
  size_t i;
  size_t h;
  size_t local_28;
  
  sVar3 = ggml_hash(in_RSI);
  uVar1 = *in_RDI;
  local_28 = sVar3 % uVar1;
  while( true ) {
    _Var2 = ggml_bitset_get((ggml_bitset_t *)in_RDI[1],local_28);
    if (!_Var2) {
      ggml_bitset_set((ggml_bitset_t *)in_RDI[1],local_28);
      *(ggml_tensor **)(in_RDI[2] + local_28 * 8) = in_RSI;
      return local_28;
    }
    if (*(ggml_tensor **)(in_RDI[2] + local_28 * 8) == in_RSI) break;
    local_28 = (local_28 + 1) % *in_RDI;
    if (local_28 == sVar3 % uVar1) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-impl.h"
                 ,0x105,"fatal error");
    }
  }
  return 0xfffffffffffffffe;
}

Assistant:

static size_t ggml_hash_insert(struct ggml_hash_set * hash_set, struct ggml_tensor * key) {
    size_t h = ggml_hash(key) % hash_set->size;

    // linear probing
    size_t i = h;
    do {
        if (!ggml_bitset_get(hash_set->used, i)) {
            ggml_bitset_set(hash_set->used, i);
            hash_set->keys[i] = key;
            return i;
        }
        if (hash_set->keys[i] == key) {
            return GGML_HASHSET_ALREADY_EXISTS;
        }
        i = (i + 1) % hash_set->size;
    } while (i != h);

    // visited all hash table entries -> not found
    GGML_ABORT("fatal error");
}